

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

void ZSTD_dedicatedDictSearch_revertCParams(ZSTD_compressionParameters *cParams)

{
  ZSTD_compressionParameters *cParams_local;
  
  if (((1 < cParams->strategy - ZSTD_fast) && (cParams->strategy - ZSTD_greedy < 3)) &&
     (cParams->hashLog = cParams->hashLog - 2, cParams->hashLog < 6)) {
    cParams->hashLog = 6;
  }
  return;
}

Assistant:

static void ZSTD_dedicatedDictSearch_revertCParams(
        ZSTD_compressionParameters* cParams) {
    switch (cParams->strategy) {
        case ZSTD_fast:
        case ZSTD_dfast:
            break;
        case ZSTD_greedy:
        case ZSTD_lazy:
        case ZSTD_lazy2:
            cParams->hashLog -= ZSTD_LAZY_DDSS_BUCKET_LOG;
            if (cParams->hashLog < ZSTD_HASHLOG_MIN) {
                cParams->hashLog = ZSTD_HASHLOG_MIN;
            }
            break;
        case ZSTD_btlazy2:
        case ZSTD_btopt:
        case ZSTD_btultra:
        case ZSTD_btultra2:
            break;
    }
}